

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# header.h
# Opt level: O0

Header * __thiscall miniros::Header::operator=(Header *this,Header *param_2)

{
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *in_RSI;
  Header *in_RDI;
  
  std::
  shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::operator=(in_RSI,&in_RDI->read_map_);
  return in_RDI;
}

Assistant:

class MINIROS_DECL Header
{
public:
  using shared_array_uint8_t = std::shared_ptr<uint8_t[]>;

  Header();
  ~Header();

  /**
   * \brief Get a value from a parsed header
   * \param key Key value
   * \param value OUT -- value corresponding to the key if there is one
   * \return Returns true if the header had the specified key in it
   */
  bool getValue(const std::string& key, std::string& value) const;
  /**
   * \brief Returns a shared pointer to the internal map used
   */
  M_stringPtr getValues() { return read_map_; }

  /**
   * \brief Parse a header out of a buffer of data
   */
  bool parse(const shared_array_uint8_t& buffer, uint32_t size, std::string& error_msg);

  /**
   * \brief Parse a header out of a buffer of data
   */
  bool parse(uint8_t* buffer, uint32_t size, std::string& error_msg);

  static void write(const M_string& key_vals, shared_array_uint8_t& buffer, uint32_t& size);

private:

  M_stringPtr read_map_;
}